

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O1

int av1_log_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  int iVar1;
  aom_variance_fn_t p_Var2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  uint sse;
  uint local_34;
  
  iVar5 = (x->e_mbd).mb_to_right_edge;
  iVar4 = (x->e_mbd).mb_to_bottom_edge;
  uVar3 = iVar4 >> 0x1f & (uint)-iVar4 >> 3;
  uVar6 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  lVar8 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar6]
          * 4 - (ulong)(iVar5 >> 0x1f & (uint)-iVar5 >> 3);
  iVar4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar6]
          * 4 - uVar3;
  iVar5 = (int)lVar8;
  if (iVar4 == 0 ||
      (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar6] * 4
      < uVar3) {
    dVar12 = 0.0;
  }
  else {
    p_Var2 = cpi->ppi->fn_ptr[0].vf;
    iVar9 = 0;
    dVar12 = 0.0;
    do {
      if (0 < iVar5) {
        lVar10 = 0;
        do {
          puVar7 = (uint8_t *)0x2b7be8;
          if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
            puVar7 = "";
          }
          iVar1 = x->plane[0].src.stride;
          uVar3 = (*p_Var2)(x->plane[0].src.buf + lVar10 + iVar9 * iVar1,iVar1,puVar7,0,&local_34);
          dVar11 = log1p((double)uVar3 * 0.0625);
          dVar12 = dVar12 + dVar11;
          lVar10 = lVar10 + 4;
        } while (lVar10 < lVar8);
      }
      iVar9 = iVar9 + 4;
    } while (iVar9 < iVar4);
  }
  iVar9 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar9 = iVar5;
  }
  iVar4 = (iVar9 >> 2) * iVar4;
  iVar5 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar5 = iVar4;
  }
  dVar12 = dVar12 / (double)(iVar5 >> 2);
  dVar11 = 7.0;
  if (dVar12 <= 7.0) {
    dVar11 = dVar12;
  }
  return (int)dVar11;
}

Assistant:

int av1_log_block_var(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs) {
  DECLARE_ALIGNED(16, static const uint16_t,
                  av1_highbd_all_zeros[MAX_SB_SIZE]) = { 0 };
  DECLARE_ALIGNED(16, static const uint8_t, av1_all_zeros[MAX_SB_SIZE]) = { 0 };

  // This function returns a score for the blocks local variance as calculated
  // by: sum of the log of the (4x4 variances) of each subblock to the current
  // block (x,bs)
  // * 32 / number of pixels in the block_size.
  // This is used for segmentation because to avoid situations in which a large
  // block with a gentle gradient gets marked high variance even though each
  // subblock has a low variance.   This allows us to assign the same segment
  // number for the same sorts of area regardless of how the partitioning goes.

  const MACROBLOCKD *xd = &x->e_mbd;
  double var = 0;
  unsigned int sse;
  int i, j;

  int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;

  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (i = 0; i < bh; i += 4) {
    for (j = 0; j < bw; j += 4) {
      if (is_cur_buf_hbd(xd)) {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride,
                        CONVERT_TO_BYTEPTR(av1_highbd_all_zeros), 0, &sse) /
                     16.0);
      } else {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride, av1_all_zeros, 0, &sse) /
                     16.0);
      }
    }
  }
  // Use average of 4x4 log variance. The range for 8 bit 0 - 9.704121561.
  var /= (bw / 4 * bh / 4);
  if (var > 7) var = 7;

  return (int)(var);
}